

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhMapInstallBucket(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)

{
  SyMemBackend *pBackend;
  uint uVar1;
  lhash_bmap_rec *plVar2;
  sxu32 sVar3;
  lhash_bmap_rec *plVar4;
  lhash_bmap_rec **pplVar5;
  lhash_bmap_rec **pplVar6;
  ulong uVar7;
  lhash_bmap_rec **pplVar8;
  uint uVar9;
  
  pBackend = &pEngine->sAllocator;
  plVar4 = (lhash_bmap_rec *)SyMemBackendPoolAlloc(pBackend,0x30);
  if (plVar4 == (lhash_bmap_rec *)0x0) {
    return -1;
  }
  uVar7 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&plVar4->iLogic + uVar7 + 4) = 0;
    uVar7 = uVar7 + 4;
  } while (uVar7 < 0x2c);
  plVar4->iLogic = iLogic;
  plVar4->iReal = iReal;
  uVar1 = pEngine->nBuckSize;
  uVar9 = (uint)iLogic & uVar1 - 1;
  pplVar5 = pEngine->apMap;
  plVar4->pNextCol = pplVar5[uVar9];
  if (pplVar5[uVar9] != (lhash_bmap_rec *)0x0) {
    pplVar5[uVar9]->pPrevCol = plVar4;
  }
  pplVar5[uVar9] = plVar4;
  pplVar5 = &pEngine->pList;
  if (pEngine->pFirst == (lhash_bmap_rec *)0x0) {
    pplVar8 = &pEngine->pFirst;
  }
  else {
    plVar2 = *pplVar5;
    pplVar8 = pplVar5;
    if (plVar2 == (lhash_bmap_rec *)0x0) goto LAB_00112e1e;
    plVar4->pNext = plVar2;
    pplVar5 = &plVar2->pPrev;
  }
  *pplVar5 = plVar4;
LAB_00112e1e:
  *pplVar8 = plVar4;
  uVar9 = pEngine->nBuckRec + 1;
  pEngine->nBuckRec = uVar9;
  if (uVar9 < 100000 && uVar1 * 3 <= uVar9) {
    pplVar5 = (lhash_bmap_rec **)SyMemBackendAlloc(pBackend,uVar1 << 4);
    if (pplVar5 != (lhash_bmap_rec **)0x0) {
      if ((uVar1 & 0xfffffff) != 0) {
        pplVar6 = (lhash_bmap_rec **)((long)pplVar5 + (ulong)(uVar1 << 4));
        pplVar8 = pplVar5;
        do {
          *(undefined1 *)pplVar8 = 0;
          if (pplVar6 <= (lhash_bmap_rec **)((long)pplVar8 + 1)) break;
          *(undefined1 *)((long)pplVar8 + 1) = 0;
          if (pplVar6 <= (lhash_bmap_rec **)((long)pplVar8 + 2)) break;
          *(undefined1 *)((long)pplVar8 + 2) = 0;
          if (pplVar6 <= (lhash_bmap_rec **)((long)pplVar8 + 3)) break;
          *(undefined1 *)((long)pplVar8 + 3) = 0;
          pplVar8 = (lhash_bmap_rec **)((long)pplVar8 + 4);
        } while (pplVar8 < pplVar6);
      }
      sVar3 = pEngine->nBuckRec;
      if (sVar3 != 0) {
        pplVar8 = &pEngine->pList;
        do {
          plVar4 = *pplVar8;
          plVar4->pNextCol = (lhash_bmap_rec *)0x0;
          plVar4->pPrevCol = (lhash_bmap_rec *)0x0;
          uVar9 = (uint)plVar4->iLogic & uVar1 * 2 - 1;
          plVar4->pNextCol = pplVar5[uVar9];
          if (pplVar5[uVar9] != (lhash_bmap_rec *)0x0) {
            pplVar5[uVar9]->pPrevCol = plVar4;
          }
          pplVar5[uVar9] = plVar4;
          pplVar8 = &plVar4->pNext;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      SyMemBackendFree(pBackend,pEngine->apMap);
      pEngine->apMap = pplVar5;
      pEngine->nBuckSize = uVar1 * 2;
    }
  }
  return 0;
}

Assistant:

static int lhMapInstallBucket(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)
{
	lhash_bmap_rec *pRec;
	sxu32 iBucket;
	/* Allocate a new instance */
	pRec = (lhash_bmap_rec *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhash_bmap_rec));
	if( pRec == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRec,sizeof(lhash_bmap_rec));
	/* Fill in the structure */
	pRec->iLogic = iLogic;
	pRec->iReal = iReal;
	iBucket = iLogic & (pEngine->nBuckSize - 1);
	pRec->pNextCol = pEngine->apMap[iBucket];
	if( pEngine->apMap[iBucket] ){
		pEngine->apMap[iBucket]->pPrevCol = pRec;
	}
	pEngine->apMap[iBucket] = pRec;
	/* Link */
	if( pEngine->pFirst == 0 ){
		pEngine->pFirst = pEngine->pList = pRec;
	}else{
		MACRO_LD_PUSH(pEngine->pList,pRec);
	}
	pEngine->nBuckRec++;
	if( (pEngine->nBuckRec >= pEngine->nBuckSize * 3) && pEngine->nBuckRec < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pEngine->nBuckSize << 1;
		lhash_bmap_rec *pEntry;
		lhash_bmap_rec **apNew;
		sxu32 n;
		
		apNew = (lhash_bmap_rec **)SyMemBackendAlloc(&pEngine->sAllocator, nNewSize * sizeof(lhash_bmap_rec *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(lhash_bmap_rec *));
			/* Rehash all entries */
			n = 0;
			pEntry = pEngine->pList;
			for(;;){
				/* Loop one */
				if( n >= pEngine->nBuckRec ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->iLogic & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket] ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pEngine->sAllocator,(void *)pEngine->apMap);
			pEngine->apMap = apNew;
			pEngine->nBuckSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}